

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_alert_get_level_channel.cc
# Opt level: O2

int __thiscall
aliyun::Alert::GetLevelChannel
          (Alert *this,AlertGetLevelChannelRequestType *req,
          AlertGetLevelChannelResponseType *response,AlertErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  AliRoaRequest *this_00;
  Value *pVVar3;
  char *pcVar4;
  allocator<char> local_2da;
  allocator<char> local_2d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  Value val;
  string local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  string str_response;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string url;
  string secheme;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  pcVar4 = "http";
  if (this->use_tls_ != false) {
    pcVar4 = "https";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar4,(allocator<char> *)&local_2d8);
  std::operator+(&local_280,&secheme,"://");
  std::operator+(&local_2d8,&local_280,this->host_);
  get_format_string_abi_cxx11_
            (&local_2a0,"/projects/%s/level_channels/%s",(req->project_name)._M_dataplus._M_p,
             (req->level)._M_dataplus._M_p);
  std::operator+(&url,&local_2d8,&local_2a0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_280);
  this_00 = (AliRoaRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->version_,(allocator<char> *)&local_2d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,this->appid_,(allocator<char> *)&local_280);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,this->secret_,(allocator<char> *)&local_2a0);
  std::__cxx11::string::string((string *)&local_200,(string *)&url);
  AliRoaRequest::AliRoaRequest(this_00,&local_1a0,&local_1c0,&local_1e0,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  if (((this->use_tls_ == false) && (pcVar4 = this->proxy_host_, pcVar4 != (char *)0x0)) &&
     (*pcVar4 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,pcVar4,(allocator<char> *)&local_2d8);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"GET",(allocator<char> *)&local_2d8);
  AliHttpRequest::setRequestMethod((AliHttpRequest *)this_00,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  iVar2 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (AlertErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_(&local_2d8,pVVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2d8,anon_var_dwarf_19ca2b + 9,(allocator<char> *)&local_280);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)&local_2d8);
        std::__cxx11::string::~string((string *)&local_2d8);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_(&local_2d8,pVVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2d8,anon_var_dwarf_19ca2b + 9,(allocator<char> *)&local_2a0);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)&local_2d8);
        std::__cxx11::string::~string((string *)&local_2d8);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_(&local_2d8,pVVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2d8,anon_var_dwarf_19ca2b + 9,&local_2d9);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)&local_2d8);
        std::__cxx11::string::~string((string *)&local_2d8);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_(&local_2d8,pVVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2d8,anon_var_dwarf_19ca2b + 9,&local_2da);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)&local_2d8);
        std::__cxx11::string::~string((string *)&local_2d8);
      }
      if (response != (AlertGetLevelChannelResponseType *)0x0 && iVar2 == 200) {
        bVar1 = Json::Value::isMember(&val,"code");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"code");
          Json::Value::asString_abi_cxx11_(&local_2d8,pVVar3);
          std::__cxx11::string::operator=((string *)response,(string *)&local_2d8);
          std::__cxx11::string::~string((string *)&local_2d8);
        }
        bVar1 = Json::Value::isMember(&val,"message");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"message");
          Json::Value::asString_abi_cxx11_(&local_2d8,pVVar3);
          std::__cxx11::string::operator=((string *)&response->message,(string *)&local_2d8);
          std::__cxx11::string::~string((string *)&local_2d8);
        }
        bVar1 = Json::Value::isMember(&val,"success");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"success");
          Json::Value::asString_abi_cxx11_(&local_2d8,pVVar3);
          std::__cxx11::string::operator=((string *)&response->success,(string *)&local_2d8);
          std::__cxx11::string::~string((string *)&local_2d8);
        }
        bVar1 = Json::Value::isMember(&val,"traceId");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"traceId");
          Json::Value::asString_abi_cxx11_(&local_2d8,pVVar3);
          std::__cxx11::string::operator=((string *)&response->trace_id,(string *)&local_2d8);
          std::__cxx11::string::~string((string *)&local_2d8);
        }
        bVar1 = Json::Value::isMember(&val,"result");
        iVar2 = 200;
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"result");
          Json::Value::asString_abi_cxx11_(&local_2d8,pVVar3);
          std::__cxx11::string::operator=((string *)&response->result,(string *)&local_2d8);
          std::__cxx11::string::~string((string *)&local_2d8);
        }
      }
      goto LAB_00137263;
    }
  }
  iVar2 = -1;
  if (error_info != (AlertErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_00137263:
  AliRoaRequest::~AliRoaRequest(this_00);
  operator_delete(this_00,0x2c8);
  std::__cxx11::string::~string((string *)&url);
  std::__cxx11::string::~string((string *)&secheme);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int Alert::GetLevelChannel(const AlertGetLevelChannelRequestType& req,
                      AlertGetLevelChannelResponseType* response,
                      AlertErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  Json::Value val;
  Json::Reader reader;
  std::string secheme = this->use_tls_ ? "https" : "http";
  std::string url = secheme  + "://" + host_ + get_format_string("/projects/%s/level_channels/%s", req.project_name.c_str(), req.level.c_str());
  AliRoaRequest* req_rpc = new AliRoaRequest(version_,
                         appid_,
                         secret_,
                         url);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  req_rpc->setRequestMethod("GET");
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}